

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-lore.c
# Opt level: O1

void lore_append_kills(textblock *tb,monster_race *race,monster_lore *lore,bitflag *known_flags)

{
  uint8_t uVar1;
  ushort uVar2;
  _Bool _Var3;
  monster_sex_t mVar4;
  char *pcVar5;
  wchar_t pronoun_index;
  
  if (((tb == (textblock *)0x0) || (race == (monster_race *)0x0)) || (lore == (monster_lore *)0x0))
  {
    __assert_fail("tb && race && lore",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/mon-lore.c"
                  ,0x36a,
                  "void lore_append_kills(textblock *, const struct monster_race *, const struct monster_lore *, const bitflag *)"
                 );
  }
  mVar4 = lore_monster_sex(race);
  _Var3 = flag_has_dbg(known_flags,0xb,1,"known_flags","RF_UNIQUE");
  if (_Var3) {
    uVar1 = race->max_num;
    if (lore->deaths == 0) {
      if (uVar1 != '\0') {
        return;
      }
      pcVar5 = "You have slain this foe.  ";
    }
    else {
      textblock_append(tb,"%s has slain %d of your ancestors",
                       *(undefined8 *)
                        (lore_pronoun_nominative_lore_pronouns + (ulong)mVar4 * 0x10 + 8));
      if (uVar1 != '\0') {
        pcVar5 = "remain";
        if (lore->deaths == 1) {
          pcVar5 = "remains";
        }
        textblock_append(tb,", who %s unavenged.  ",pcVar5);
        goto LAB_0016dcc1;
      }
      pcVar5 = ", but you have taken revenge!  ";
    }
LAB_0016dcb7:
    textblock_append(tb,pcVar5);
  }
  else {
    uVar2 = lore->deaths;
    if (uVar2 == 0) {
      if (lore->pkills == 0) {
        if (lore->tkills == 0) {
          pcVar5 = "No battles to the death are recalled.  ";
          goto LAB_0016dcb7;
        }
        pcVar5 = "Your ancestors have killed at least %d of these creatures.  ";
      }
      else {
        pcVar5 = "You have killed at least %d of these creatures.  ";
      }
    }
    else {
      pcVar5 = "have";
      if (uVar2 == 1) {
        pcVar5 = "has";
      }
      textblock_append(tb,"%d of your ancestors %s been killed by this creature, ",(ulong)uVar2,
                       pcVar5);
      if (lore->pkills == 0) {
        if (lore->tkills == 0) {
          textblock_append_c(tb,'\x04',"and %s is not ever known to have been defeated.  ",
                             *(undefined8 *)
                              (lore_pronoun_nominative_lore_pronouns + (ulong)mVar4 * 0x10));
          goto LAB_0016dcc1;
        }
        pcVar5 = "and your ancestors have exterminated at least %d of the creatures.  ";
      }
      else {
        pcVar5 = "and you have exterminated at least %d of the creatures.  ";
      }
    }
    textblock_append(tb,pcVar5);
  }
LAB_0016dcc1:
  textblock_append(tb,"\n");
  return;
}

Assistant:

void lore_append_kills(textblock *tb, const struct monster_race *race,
					   const struct monster_lore *lore,
					   const bitflag known_flags[RF_SIZE])
{
	monster_sex_t msex = MON_SEX_NEUTER;
	bool out = true;

	assert(tb && race && lore);

	/* Extract a gender (if applicable) */
	msex = lore_monster_sex(race);

	/* Treat by whether unique, then by whether they have any player kills */
	if (rf_has(known_flags, RF_UNIQUE)) {
		/* Hack -- Determine if the unique is "dead" */
		bool dead = (race->max_num == 0) ? true : false;

		/* We've been killed... */
		if (lore->deaths) {
			/* Killed ancestors */
			textblock_append(tb, "%s has slain %d of your ancestors",
							 lore_pronoun_nominative(msex, true), lore->deaths);

			/* But we've also killed it */
			if (dead)
				textblock_append(tb, ", but you have taken revenge!  ");

			/* Unavenged (ever) */
			else
				textblock_append(tb, ", who %s unavenged.  ",
								 VERB_AGREEMENT(lore->deaths, "remains",
												"remain"));
		} else if (dead) { /* Dead unique who never hurt us */
			textblock_append(tb, "You have slain this foe.  ");
		} else {
			/* Alive and never killed us */
			out = false;
		}
	} else if (lore->deaths) {
		/* Dead ancestors */
		textblock_append(tb, "%d of your ancestors %s been killed by this creature, ", lore->deaths, VERB_AGREEMENT(lore->deaths, "has", "have"));

		if (lore->pkills) {
			/* Some kills this life */
			textblock_append(tb, "and you have exterminated at least %d of the creatures.  ", lore->pkills);
		} else if (lore->tkills) {
			/* Some kills past lives */
			textblock_append(tb, "and your ancestors have exterminated at least %d of the creatures.  ", lore->tkills);
		} else {
			/* No kills */
			textblock_append_c(tb, COLOUR_RED, "and %s is not ever known to have been defeated.  ", lore_pronoun_nominative(msex, false));
		}
	} else {
		if (lore->pkills) {
			/* Killed some this life */
			textblock_append(tb, "You have killed at least %d of these creatures.  ", lore->pkills);
		} else if (lore->tkills) {
			/* Killed some last life */
			textblock_append(tb, "Your ancestors have killed at least %d of these creatures.  ", lore->tkills);
		} else {
			/* Killed none */
			textblock_append(tb, "No battles to the death are recalled.  ");
		}
	}

	/* Separate */
	if (out)
		textblock_append(tb, "\n");
}